

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testServerBuffering.cpp
# Opt level: O2

string * trim_newline(string *__return_storage_ptr__,string *_buffer)

{
  char cVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)_buffer);
  while ((__return_storage_ptr__->_M_string_length != 0 &&
         ((cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p
                   [__return_storage_ptr__->_M_string_length - 1], cVar1 == '\r' || (cVar1 == '\n'))
         ))) {
    std::__cxx11::string::pop_back();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim_newline(const std::string& _buffer)
{
  auto buffer = _buffer;
  while (!buffer.empty() && (buffer.back() == '\n' || buffer.back() == '\r')) {
    buffer.pop_back();
  }
  return buffer;
}